

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall
soul::heart::StructElement::visitExpressions
          (StructElement *this,ExpressionVisitorFn fn,AccessType mode)

{
  (*(((this->parent).object)->super_Object)._vptr_Object[3])();
  std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
            (fn,&this->parent,mode);
  if ((StructElement *)(this->parent).object != this) {
    return;
  }
  throwInternalCompilerError("parent != *this","visitExpressions",0x28f);
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn, AccessType mode) override
        {
            parent->visitExpressions (fn, mode);
            fn (parent, mode);
            SOUL_ASSERT (parent != *this);
        }